

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  int iVar1;
  Decoration *pDVar2;
  CompilerGLSL *this_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  runtime_error *prVar7;
  mapped_type *pmVar8;
  SPIRType *pSVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  Bitset member_flags;
  undefined1 local_a0 [8];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_98;
  SPIRType *local_60;
  ID *local_58;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  CompilerGLSL *local_48;
  ulong local_40;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_38;
  
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    if (type->storage == StorageClassPhysicalStorageBuffer) {
      if (type->pointer == false) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_a0 = (undefined1  [8])(local_a0 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"Types in PhysicalStorageBufferEXT must be pointers.","");
        ::std::runtime_error::runtime_error(prVar7,(string *)local_a0);
        *(undefined ***)prVar7 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
        return 8;
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0 = (undefined1  [8])(local_a0 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,
                 "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                 ,"");
      ::std::runtime_error::runtime_error(prVar7,(string *)local_a0);
      *(undefined ***)prVar7 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size != 0) {
        local_50 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&(this->super_Compiler).ir.meta;
        local_58 = &(type->super_IVariant).self;
        uVar10 = 1;
        uVar11 = 0;
        local_40 = 0;
        uVar3 = 1;
        local_60 = type;
        local_48 = this;
        do {
          pSVar9 = local_60;
          pmVar8 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_50,local_58);
          pDVar2 = (pmVar8->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
          local_a0 = (undefined1  [8])pDVar2[uVar11].decoration_flags.lower;
          local_38._M_h = (__hashtable_alloc *)(local_a0 + 8);
          local_98._M_buckets = (__buckets_ptr)0x0;
          local_98._M_bucket_count = pDVar2[uVar11].decoration_flags.higher._M_h._M_bucket_count;
          local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_98._M_element_count = pDVar2[uVar11].decoration_flags.higher._M_h._M_element_count;
          local_98._M_rehash_policy._M_max_load_factor =
               pDVar2[uVar11].decoration_flags.higher._M_h._M_rehash_policy._M_max_load_factor;
          local_98._M_rehash_policy._4_4_ =
               *(undefined4 *)
                &pDVar2[uVar11].decoration_flags.higher._M_h._M_rehash_policy.field_0x4;
          local_98._M_rehash_policy._M_next_resize =
               pDVar2[uVar11].decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
          local_98._M_single_bucket = (__node_base_ptr)0x0;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_38._M_h,&pDVar2[uVar11].decoration_flags.higher._M_h,&local_38);
          this_00 = local_48;
          pSVar9 = Variant::get<spirv_cross::SPIRType>
                             ((local_48->super_Compiler).ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              (pSVar9->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                              [uVar11].id);
          uVar5 = type_to_packed_alignment(this_00,pSVar9,(Bitset *)local_a0,packing);
          iVar1 = *(int *)&(pSVar9->super_IVariant).field_0xc;
          uVar6 = type_to_packed_size(this_00,pSVar9,(Bitset *)local_a0,packing);
          uVar4 = 1;
          if (iVar1 == 0xf) {
            uVar4 = uVar5;
          }
          if (uVar3 < uVar5) {
            uVar3 = uVar5;
          }
          uVar12 = uVar6 + (-uVar3 & ((int)local_40 + uVar3) - 1);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)(local_a0 + 8));
          uVar11 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          local_40 = (ulong)uVar12;
          uVar3 = uVar4;
        } while (uVar11 < (local_60->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                );
        return uVar12;
      }
      return 0;
    }
    uVar3 = type_to_packed_base_size(this,type,(BufferPackingStandard)flags);
    if ((packing & ~BufferPackingStd430) == BufferPackingScalar) {
      return uVar3 * type->vecsize * type->columns;
    }
    uVar10 = type->vecsize;
    uVar12 = type->columns;
    uVar5 = uVar10 * uVar3;
    uVar4 = 0;
    if (uVar12 == 1) {
      uVar4 = uVar5;
    }
    if ((1 < uVar12 & (byte)((flags->lower & 0xffffffff) >> 5) & 7) == 1) {
      if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) ||
         (uVar10 == 3)) {
        uVar4 = uVar3 * uVar12 * 4;
      }
      else {
        uVar4 = uVar5 * uVar12;
      }
    }
    if ((1 < uVar10 & (byte)(flags->lower >> 4) & 0xf) == 1) {
      if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) ||
         (uVar12 == 3)) {
        uVar4 = uVar5 * 4;
      }
      else {
        uVar4 = uVar5 * uVar12;
      }
    }
    if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer || uVar12 < 2) {
      return uVar4;
    }
    uVar12 = type->width;
  }
  else {
    uVar3 = to_array_size_literal
                      (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
    uVar4 = type_to_packed_array_stride(this,type,flags,packing);
    uVar4 = uVar4 * uVar3;
    if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer) {
      return uVar4;
    }
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      return uVar4;
    }
    uVar12 = type->width;
    uVar10 = type->vecsize;
  }
  return uVar4 + (uVar12 >> 3) * (uVar10 - 4);
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	if (!type.array.empty())
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (type.storage == StorageClassPhysicalStorageBufferEXT)
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}